

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall
FIX::IncorrectDataFormat::IncorrectDataFormat(IncorrectDataFormat *this,int f,string *what)

{
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *what_local;
  IncorrectDataFormat *pIStack_10;
  int f_local;
  IncorrectDataFormat *this_local;
  
  local_20 = what;
  what_local._4_4_ = f;
  pIStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Incorrect data format for value",&local_41);
  Exception::Exception(&this->super_Exception,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  *(undefined ***)&this->super_Exception = &PTR__IncorrectDataFormat_0045ca88;
  this->field = what_local._4_4_;
  return;
}

Assistant:

IncorrectDataFormat( int f = 0, const std::string& what = "" )
    : Exception( "Incorrect data format for value", what ),
                 field( f ) {}